

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_tpdf_free(lysf_ctx *ctx,lysp_tpdf *tpdf)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  uint64_t c__;
  lysp_ext_instance *plVar3;
  long lVar4;
  
  lydict_remove(ctx->ctx,tpdf->name);
  lydict_remove(ctx->ctx,tpdf->units);
  lydict_remove(ctx->ctx,(tpdf->dflt).str);
  lydict_remove(ctx->ctx,tpdf->dsc);
  lydict_remove(ctx->ctx,tpdf->ref);
  lVar4 = 0;
  plVar3 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = tpdf->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar2 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar2 = plVar1[-1].exts;
    }
    if (plVar2 <= plVar3) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar4));
    plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
    lVar4 = lVar4 + 0x70;
  }
  if (plVar1 != (lysp_ext_instance *)0x0) {
    free(&plVar1[-1].exts);
  }
  lysp_type_free(ctx,&tpdf->type);
  return;
}

Assistant:

static void
lysp_tpdf_free(struct lysf_ctx *ctx, struct lysp_tpdf *tpdf)
{
    lydict_remove(ctx->ctx, tpdf->name);
    lydict_remove(ctx->ctx, tpdf->units);
    lydict_remove(ctx->ctx, tpdf->dflt.str);
    lydict_remove(ctx->ctx, tpdf->dsc);
    lydict_remove(ctx->ctx, tpdf->ref);
    FREE_ARRAY(ctx, tpdf->exts, lysp_ext_instance_free);

    lysp_type_free(ctx, &tpdf->type);

}